

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O2

void Style::addFieldAlias(Entry *entry,u16string *alias,u16string *actual)

{
  pointer pbVar1;
  vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *pvVar2;
  bool bVar3;
  iterator iVar4;
  __normal_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
  _Var5;
  long lVar6;
  __hashtable *__h;
  vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *pvVar7;
  const_iterator __position;
  initializer_list<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  __l;
  allocator_type local_129;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  local_128;
  undefined1 local_110 [128];
  Field actualFieldCopy;
  
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(entry->fields)._M_h,actual);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
      ._M_cur != (__node_type *)0x0) {
    Field::Field(&actualFieldCopy,
                 (Field *)((long)iVar4.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                                 ._M_cur + 0x28));
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    _M_assign(&actualFieldCopy.name,alias);
    std::
    pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
    ::pair<Style::Field_&,_true>
              ((pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
                *)local_110,alias,&actualFieldCopy);
    std::
    _Hashtable<std::__cxx11::u16string,std::pair<std::__cxx11::u16string_const,Style::Field>,std::allocator<std::pair<std::__cxx11::u16string_const,Style::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::u16string>,std::hash<std::__cxx11::u16string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::u16string_const,Style::Field>>
              ((_Hashtable<std::__cxx11::u16string,std::pair<std::__cxx11::u16string_const,Style::Field>,std::allocator<std::pair<std::__cxx11::u16string_const,Style::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::u16string>,std::hash<std::__cxx11::u16string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&entry->fields,local_110);
    std::
    pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
    ::~pair((pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
             *)local_110);
    __position._M_current =
         (entry->constraints).all.
         super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (entry->constraints).all.
             super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
LAB_00177b09:
    if (__position._M_current != pbVar1) {
      bVar3 = std::operator==(__position._M_current,actual);
      if (!bVar3) goto code_r0x00177b1d;
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::erase(&(entry->constraints).all,__position);
      std::__cxx11::u16string::u16string((u16string *)local_110,actual);
      std::__cxx11::u16string::u16string((u16string *)(local_110 + 0x20),alias);
      __l._M_len = 2;
      __l._M_array = (iterator)local_110;
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::vector(&local_128,__l,&local_129);
      std::
      vector<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>,std::allocator<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>>
      ::emplace_back<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>
                ((vector<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>,std::allocator<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>>
                  *)&(entry->constraints).one,&local_128);
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::~vector(&local_128);
      lVar6 = 0x20;
      do {
        std::__cxx11::u16string::~u16string((u16string *)(local_110 + lVar6));
        lVar6 = lVar6 + -0x20;
      } while (lVar6 != -0x20);
      goto LAB_00177c18;
    }
    pvVar2 = (vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *)
             (entry->constraints).some.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar7 = (vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *)
                  (entry->constraints).some.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar7 != pvVar2;
        pvVar7 = pvVar7 + 0x18) {
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::u16string*,std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::u16string_const>>
                        (*(undefined8 *)pvVar7,*(undefined8 *)(pvVar7 + 8),actual);
      if (_Var5._M_current !=
          *(basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> **)
           (pvVar7 + 8)) {
        std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>::
        emplace_back<std::__cxx11::u16string_const&>(pvVar7,alias);
        goto LAB_00177c18;
      }
    }
    pvVar2 = (vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *)
             (entry->constraints).one.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar7 = (vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *)
                  (entry->constraints).one.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar7 != pvVar2;
        pvVar7 = pvVar7 + 0x18) {
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::u16string*,std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::u16string_const>>
                        (*(undefined8 *)pvVar7,*(undefined8 *)(pvVar7 + 8),actual);
      if (_Var5._M_current !=
          *(basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> **)
           (pvVar7 + 8)) {
        std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>::
        emplace_back<std::__cxx11::u16string_const&>(pvVar7,alias);
        break;
      }
    }
LAB_00177c18:
    Field::~Field(&actualFieldCopy);
  }
  return;
code_r0x00177b1d:
  __position._M_current = __position._M_current + 1;
  goto LAB_00177b09;
}

Assistant:

void addFieldAlias (Entry &entry, const u16string &alias, const u16string &actual) {
    auto itr = entry.fields.find(actual);
    if (itr == entry.fields.end()) return;

    Field actualFieldCopy = itr->second;
    actualFieldCopy.name = alias;

    entry.fields.insert({ alias, actualFieldCopy });


    // TODO: Well, you get the idea
    auto &constraints = entry.constraints;
    for (auto itr2 = constraints.all.begin(), end = constraints.all.end(); itr2 != end; itr2++) {
        if (*itr2 == actual) {
            constraints.all.erase(itr2);
            constraints.one.emplace_back(vector { actual, alias });
            return;
        }
    }

    for (auto &fields : constraints.some) {
        if (std::find(fields.begin(), fields.end(), actual) != fields.end()) {
            fields.emplace_back(alias);
            return;
        }
    }

    for (auto &fields : constraints.one) {
        if (std::find(fields.begin(), fields.end(), actual) != fields.end()) {
            fields.emplace_back(alias);
            return;
        }
    }
}